

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall GEO::LineInput::get_fields(LineInput *this,char *separators)

{
  char *context;
  char *local_30;
  char *local_28;
  
  std::vector<char_*,_std::allocator<char_*>_>::resize(&this->field_,0);
  local_28 = (char *)0x0;
  local_30 = strtok_r(this->line_,separators,&local_28);
  while (local_30 != (char *)0x0) {
    std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->field_,&local_30);
    local_30 = strtok_r((char *)0x0,separators,&local_28);
  }
  return;
}

Assistant:

void LineInput::get_fields(const char* separators) {
        field_.resize(0);
        char* context = nullptr;
        char* tok = safe_strtok(line_, separators, &context);
        while(tok != nullptr) {
            field_.push_back(tok);
            tok = safe_strtok(nullptr, separators, &context);
        }
    }